

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void fts5IndexExtractColset(int *pRc,Fts5Colset *pColset,u8 *pPos,int nPos,Fts5Buffer *pBuf)

{
  u32 nData;
  u8 *puStack_40;
  int nSub;
  u8 *pSub;
  Fts5Buffer *pFStack_30;
  int i;
  Fts5Buffer *pBuf_local;
  u8 *puStack_20;
  int nPos_local;
  u8 *pPos_local;
  Fts5Colset *pColset_local;
  int *pRc_local;
  
  if (*pRc == 0) {
    pFStack_30 = pBuf;
    pBuf_local._4_4_ = nPos;
    puStack_20 = pPos;
    pPos_local = (u8 *)pColset;
    pColset_local = (Fts5Colset *)pRc;
    sqlite3Fts5BufferZero(pBuf);
    for (pSub._4_4_ = 0; pSub._4_4_ < *(int *)pPos_local; pSub._4_4_ = pSub._4_4_ + 1) {
      puStack_40 = puStack_20;
      nData = fts5IndexExtractCol(&stack0xffffffffffffffc0,pBuf_local._4_4_,
                                  *(int *)(pPos_local + (long)pSub._4_4_ * 4 + 4));
      if (nData != 0) {
        sqlite3Fts5BufferAppendBlob(&pColset_local->nCol,pFStack_30,nData,puStack_40);
      }
    }
  }
  return;
}

Assistant:

static void fts5IndexExtractColset(
  int *pRc,
  Fts5Colset *pColset,            /* Colset to filter on */
  const u8 *pPos, int nPos,       /* Position list */
  Fts5Buffer *pBuf                /* Output buffer */
){
  if( *pRc==SQLITE_OK ){
    int i;
    fts5BufferZero(pBuf);
    for(i=0; i<pColset->nCol; i++){
      const u8 *pSub = pPos;
      int nSub = fts5IndexExtractCol(&pSub, nPos, pColset->aiCol[i]);
      if( nSub ){
        fts5BufferAppendBlob(pRc, pBuf, nSub, pSub);
      }
    }
  }
}